

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents::
~TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents
          (TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents *this)

{
  TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents *this_local;
  
  ~TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureOnExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {2, 3} };
        ThrowingObject2D obj;
        CHECK_ARRAY2D_CLOSE (data, obj, 2, 2, 0.01f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "data"));
    CHECK(strstr(reporter.lastFailedMessage, "obj"));
}